

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computePrimalray4Col
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *direction,SPxId enterId)

{
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *this_01;
  undefined8 uVar1;
  type_conflict5 tVar2;
  int iVar3;
  int j;
  long lVar4;
  uint uVar5;
  SPxId i;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sign;
  int local_140;
  DataKey local_138;
  DataKey local_130;
  cpp_dec_float<100U,_int,_void> local_128;
  DataKey local_d8;
  cpp_dec_float<100U,_int,_void> local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  local_128.data._M_elems._0_8_ = local_128.data._M_elems._0_8_ & 0xffffffff00000000;
  local_130 = enterId.super_DataKey;
  tVar2 = boost::multiprecision::operator>(direction,(int *)&local_128);
  if (tVar2) {
    uVar5 = 0x3ff00000;
  }
  else {
    uVar5 = 0xbff00000;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_d0,(double)((ulong)uVar5 << 0x20),(type *)0x0);
  (this->primalRay).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  this_00 = &this->primalRay;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMax(this_00,(this->theFvec->thedelta).super_IdxSet.num + 1);
  this_01 = &(this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set;
  for (lVar4 = 0; lVar4 < (this->theFvec->thedelta).super_IdxSet.num; lVar4 = lVar4 + 1) {
    local_138 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).theBaseId.data[(this->theFvec->thedelta).super_IdxSet.idx[lVar4]].super_DataKey;
    if (0 < local_138.info) {
      SPxColId::SPxColId((SPxColId *)&local_d8,(SPxId *)&local_138);
      iVar3 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
              ::number(this_01,&local_d8);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::value((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_80,&this->theFvec->thedelta,(int)lVar4);
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x10;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems._56_5_ = 0;
      local_128.data._M_elems[0xf]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_128,&local_d0,&local_80);
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add(this_00,iVar3,
            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&local_128);
    }
  }
  local_140 = enterId.super_DataKey.info;
  if (0 < local_140) {
    SPxColId::SPxColId((SPxColId *)&local_80,(SPxId *)&local_130);
    iVar3 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(this_01,(DataKey *)&local_80);
    local_128.data._M_elems[0] = local_d0.data._M_elems[0];
    local_128.data._M_elems[1] = local_d0.data._M_elems[1];
    uVar1 = local_128.data._M_elems._0_8_;
    local_128.data._M_elems[2] = local_d0.data._M_elems[2];
    local_128.data._M_elems[3] = local_d0.data._M_elems[3];
    local_128.data._M_elems[0xc] = local_d0.data._M_elems[0xc];
    local_128.data._M_elems[0xd] = local_d0.data._M_elems[0xd];
    local_128.data._M_elems._56_5_ = local_d0.data._M_elems._56_5_;
    local_128.data._M_elems[0xf]._1_3_ = local_d0.data._M_elems[0xf]._1_3_;
    local_128.data._M_elems[8] = local_d0.data._M_elems[8];
    local_128.data._M_elems[9] = local_d0.data._M_elems[9];
    local_128.data._M_elems[10] = local_d0.data._M_elems[10];
    local_128.data._M_elems[0xb] = local_d0.data._M_elems[0xb];
    local_128.data._M_elems[4] = local_d0.data._M_elems[4];
    local_128.data._M_elems[5] = local_d0.data._M_elems[5];
    local_128.data._M_elems[6] = local_d0.data._M_elems[6];
    local_128.data._M_elems[7] = local_d0.data._M_elems[7];
    local_128.exp = local_d0.exp;
    local_128.neg = local_d0.neg;
    local_128.fpclass = local_d0.fpclass;
    local_128.prec_elem = local_d0.prec_elem;
    local_128.data._M_elems[0] = local_d0.data._M_elems[0];
    if (local_d0.fpclass != cpp_dec_float_finite || local_128.data._M_elems[0] != 0) {
      local_128.neg = (bool)(local_d0.neg ^ 1);
    }
    local_128.data._M_elems._0_8_ = uVar1;
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(this_00,iVar3,
          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_128);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computePrimalray4Col(R direction, SPxId enterId)
{
   R sign = (direction > 0 ? 1.0 : -1.0);

   primalRay.clear();
   primalRay.setMax(fVec().delta().size() + 1);

   for(int j = 0; j < fVec().delta().size(); ++j)
   {
      SPxId i = this->baseId(fVec().idx().index(j));

      if(i.isSPxColId())
         primalRay.add(this->number(SPxColId(i)), sign * fVec().delta().value(j));
   }

   if(enterId.isSPxColId())
      primalRay.add(this->number(SPxColId(enterId)), -sign);
}